

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenubar.cpp
# Opt level: O3

void __thiscall QDBusMenuBar::unregisterMenuBar(QDBusMenuBar *this)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  WId WVar4;
  undefined4 extraout_var;
  long *plVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QLatin1String QVar10;
  QDBusPendingReply<> r;
  QDBusConnection connection;
  QDBusError local_168;
  QArrayData *local_128;
  QArrayData *local_110;
  undefined8 *local_108;
  QDBusError local_f8;
  QArrayData *local_b8;
  QArrayData *local_a0;
  undefined8 *local_98;
  QString local_88;
  char *local_70;
  QDBusPendingReplyBase local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QDBusConnection::sessionBus();
  if (((*(long *)(this + 0x28) != 0) && (*(int *)(*(long *)(this + 0x28) + 4) != 0)) &&
     (*(long *)(this + 0x30) != 0)) {
    QGuiApplication::platformName();
    if (local_f8.msg.d.ptr == (char16_t *)0x3) {
      QVar7.m_data = (storage_type_conflict *)local_f8.msg.d.d;
      QVar7.m_size = 3;
      QVar10.m_data = "xcb";
      QVar10.m_size = 3;
      cVar2 = QtPrivate::equalStrings(QVar7,QVar10);
    }
    else {
      cVar2 = '\0';
    }
    if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
      }
    }
    if (cVar2 != '\0') {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QVar8.m_data = (storage_type *)0x1f;
      QVar8.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar8);
      local_168.code = local_f8.code;
      local_168._4_4_ = local_f8._4_4_;
      local_168.msg.d.d = local_f8.msg.d.d;
      local_168.msg.d.ptr = local_f8.msg.d.ptr;
      QVar9.m_data = (storage_type *)0x20;
      QVar9.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar9);
      local_88.d.d._0_4_ = local_f8.code;
      local_88.d.d._4_4_ = local_f8._4_4_;
      local_88.d.ptr._0_4_ = SUB84(local_f8.msg.d.d,0);
      local_88.d.ptr._4_4_ = (undefined4)((ulong)local_f8.msg.d.d >> 0x20);
      local_88.d.size._0_4_ = SUB84(local_f8.msg.d.ptr,0);
      local_88.d.size._4_4_ = (undefined4)((ulong)local_f8.msg.d.ptr >> 0x20);
      QDBusMenuRegistrarInterface::QDBusMenuRegistrarInterface
                ((QDBusMenuRegistrarInterface *)&local_58,(QString *)&local_168,&local_88,
                 (QDBusConnection *)&local_40,(QObject *)this);
      piVar1 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10);
        }
      }
      if ((QArrayData *)local_168._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_168._0_8_,2,0x10);
        }
      }
      local_60 = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
      WVar4 = QWindow::winId(*(QWindow **)(this + 0x30));
      QDBusMenuRegistrarInterface::UnregisterWindow
                ((QDBusPendingReply<> *)&local_60,(QDBusMenuRegistrarInterface *)&local_58,
                 (uint)WVar4);
      QDBusPendingCall::waitForFinished();
      cVar2 = QDBusPendingCall::isError();
      if (cVar2 != '\0') {
        local_88.d.d._0_4_ = 2;
        local_88.d.d._4_4_ = 0;
        local_88.d.ptr._0_4_ = 0;
        local_88.d.ptr._4_4_ = 0;
        local_88.d.size._0_4_ = 0;
        local_88.d.size._4_4_ = 0;
        local_70 = "default";
        QDBusPendingCall::error();
        QDBusError::name();
        QString::toUtf8_helper((QString *)&local_a0);
        if (local_98 == (undefined8 *)0x0) {
          local_98 = &QByteArray::_empty;
        }
        QDBusPendingCall::error();
        QDBusError::message();
        QString::toUtf8_helper((QString *)&local_110);
        if (local_108 == (undefined8 *)0x0) {
          local_108 = &QByteArray::_empty;
        }
        QMessageLogger::warning
                  ((char *)&local_88,"Failed to unregister window menu, reason: %s (\"%s\")",
                   local_98,local_108);
        if (local_110 != (QArrayData *)0x0) {
          LOCK();
          (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_110->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_110->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_110,1,0x10);
          }
        }
        if (local_128 != (QArrayData *)0x0) {
          LOCK();
          (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_128,2,0x10);
          }
        }
        QDBusError::~QDBusError(&local_168);
        if (local_a0 != (QArrayData *)0x0) {
          LOCK();
          (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_a0,1,0x10);
          }
        }
        if (local_b8 != (QArrayData *)0x0) {
          LOCK();
          (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_b8,2,0x10);
          }
        }
        QDBusError::~QDBusError(&local_f8);
      }
      QDBusPendingReplyBase::~QDBusPendingReplyBase(&local_60);
      QDBusMenuRegistrarInterface::~QDBusMenuRegistrarInterface
                ((QDBusMenuRegistrarInterface *)&local_58);
    }
    iVar3 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0x13])();
    if (CONCAT44(extraout_var,iVar3) == 0) {
      plVar5 = (long *)0x0;
    }
    else {
      plVar5 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar3),&QPlatformServices::typeinfo,
                                      &QDesktopUnixServices::typeinfo,0);
    }
    if ((*(long *)(this + 0x28) == 0) || (*(int *)(*(long *)(this + 0x28) + 4) == 0)) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(undefined8 *)(this + 0x30);
    }
    (**(code **)(*plVar5 + 0x48))(plVar5,uVar6);
  }
  if (*(long *)(this + 0x48) != 0) {
    QDBusConnection::unregisterObject(&local_40,this + 0x38,0);
  }
  QDBusConnection::~QDBusConnection((QDBusConnection *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuBar::unregisterMenuBar()
{
    QDBusConnection connection = QDBusConnection::sessionBus();

    if (m_window) {
        if (QGuiApplication::platformName() == "xcb"_L1) {
            QDBusMenuRegistrarInterface registrar(REGISTRAR_SERVICE, REGISTRAR_PATH, connection, this);
            QDBusPendingReply<> r = registrar.UnregisterWindow(m_window->winId());
            r.waitForFinished();
            if (r.isError())
                qWarning("Failed to unregister window menu, reason: %s (\"%s\")",
                         qUtf8Printable(r.error().name()), qUtf8Printable(r.error().message()));
        }

        const auto unixServices = dynamic_cast<QDesktopUnixServices *>(
            QGuiApplicationPrivate::platformIntegration()->services());
        unixServices->unregisterDBusMenuForWindow(m_window);
    }

    if (!m_objectPath.isEmpty()) {
        connection.unregisterObject(m_objectPath);
    }
}